

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void inverse_transform_inter_block
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r,int plane,int blk_row,
               int blk_col,TX_SIZE tx_size)

{
  _Bool _Var1;
  ushort uVar2;
  ushort uVar3;
  int stride;
  MB_MODE_INFO *pMVar4;
  tran_low_t *ptVar5;
  byte tx_type;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  
  _Var1 = (cm->features).reduced_tx_set_used;
  pMVar4 = *(dcb->xd).mi;
  uVar8 = (ulong)tx_size;
  if (((dcb->xd).lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0) &&
     ((0x61810UL >> (uVar8 & 0x3f) & 1) == 0)) {
    if (plane == 0) {
      tx_type = (dcb->xd).tx_type_map[(dcb->xd).tx_type_map_stride * blk_row + blk_col];
    }
    else {
      cVar6 = (char)*(ushort *)&pMVar4->field_0xa7;
      if ((cVar6 < '\0') || ('\0' < pMVar4->ref_frame[0])) {
        tx_type = (dcb->xd).tx_type_map
                  [(blk_row << ((byte)(dcb->xd).plane[1].subsampling_y & 0x1f)) *
                   (dcb->xd).tx_type_map_stride +
                   (blk_col << ((byte)(dcb->xd).plane[1].subsampling_x & 0x1f))];
        uVar7 = 1;
        if (-1 < cVar6) {
          uVar7 = (uint)('\0' < pMVar4->ref_frame[0]);
        }
      }
      else {
        tx_type = intra_mode_to_tx_type__intra_mode_to_tx_type
                  [(byte)get_uv_mode_uv2y[pMVar4->uv_mode]];
        uVar7 = 0;
      }
      if ((0x18608UL >> (uVar8 & 0x3f) & 1) == 0) {
        if (_Var1 == false) {
          uVar7 = (uint)av1_ext_tx_set_lookup[0]
                        [(ulong)((0x60604UL >> (uVar8 & 0x3f) & 1) != 0) + (ulong)(uVar7 * 2)];
        }
        else {
          uVar7 = (uint)(byte)((uVar7 == 0) + 1);
        }
      }
      if (*(int *)((long)av1_ext_tx_used[0] + (ulong)tx_type * 4 + (ulong)(uVar7 << 6)) == 0) {
        tx_type = 0;
      }
    }
  }
  else {
    tx_type = 0;
  }
  stride = (dcb->xd).plane[plane].dst.stride;
  uVar2 = dcb->cb_offset[plane];
  ptVar5 = dcb->dqcoeff_block[plane];
  uVar3 = dcb->eob_data[plane][dcb->txb_offset[plane]].max_scan_line;
  av1_inverse_transform_block
            (&dcb->xd,ptVar5 + uVar2,plane,tx_type,tx_size,
             (dcb->xd).plane[plane].dst.buf + (blk_row * stride + blk_col) * 4,stride,
             (uint)dcb->eob_data[plane][dcb->txb_offset[plane]].eob,(uint)_Var1);
  memset(ptVar5 + uVar2,0,(ulong)uVar3 * 4 + 4);
  return;
}

Assistant:

static inline void inverse_transform_inter_block(
    const AV1_COMMON *const cm, DecoderCodingBlock *dcb, aom_reader *const r,
    const int plane, const int blk_row, const int blk_col,
    const TX_SIZE tx_size) {
  (void)r;
  MACROBLOCKD *const xd = &dcb->xd;
  PLANE_TYPE plane_type = get_plane_type(plane);
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const bool reduced_tx_set_used = cm->features.reduced_tx_set_used;
  // tx_type was read out in av1_read_coeffs_txb.
  const TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, blk_row, blk_col,
                                          tx_size, reduced_tx_set_used);

  uint8_t *dst =
      &pd->dst.buf[(blk_row * pd->dst.stride + blk_col) << MI_SIZE_LOG2];
  inverse_transform_block(dcb, plane, tx_type, tx_size, dst, pd->dst.stride,
                          reduced_tx_set_used);
#if CONFIG_MISMATCH_DEBUG
  int pixel_c, pixel_r;
  BLOCK_SIZE bsize = txsize_to_bsize[tx_size];
  int blk_w = block_size_wide[bsize];
  int blk_h = block_size_high[bsize];
  const int mi_row = -xd->mb_to_top_edge >> (3 + MI_SIZE_LOG2);
  const int mi_col = -xd->mb_to_left_edge >> (3 + MI_SIZE_LOG2);
  mi_to_pixel_loc(&pixel_c, &pixel_r, mi_col, mi_row, blk_col, blk_row,
                  pd->subsampling_x, pd->subsampling_y);
  mismatch_check_block_tx(dst, pd->dst.stride, cm->current_frame.order_hint,
                          plane, pixel_c, pixel_r, blk_w, blk_h,
                          xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
#endif
}